

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O3

natwm_error color_value_from_config_value(config_value *config_value,color_value **result)

{
  natwm_error nVar1;
  color_value *local_20;
  color_value *value;
  
  nVar1 = INVALID_INPUT_ERROR;
  if ((config_value != (config_value *)0x0) && (config_value->type == STRING)) {
    local_20 = (color_value *)0x0;
    nVar1 = color_value_from_string((config_value->data).string,&local_20);
    if (nVar1 == NO_ERROR) {
      *result = local_20;
    }
  }
  return nVar1;
}

Assistant:

static enum natwm_error color_value_from_config_value(const struct config_value *config_value,
                                                      struct color_value **result)
{
        if (config_value == NULL || config_value->type != STRING) {
                return INVALID_INPUT_ERROR;
        }

        struct color_value *value = NULL;
        enum natwm_error err = color_value_from_string(config_value->data.string, &value);

        if (err != NO_ERROR) {
                return err;
        }

        *result = value;

        return NO_ERROR;
}